

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Intrinsics.cpp
# Opt level: O2

IntrinsicType __thiscall soul::getIntrinsicTypeFromName(soul *this,string_view s)

{
  bool bVar1;
  IntrinsicType IVar2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  basic_string_view<char,_std::char_traits<char>_> __x_15;
  basic_string_view<char,_std::char_traits<char>_> __x_16;
  basic_string_view<char,_std::char_traits<char>_> __x_17;
  basic_string_view<char,_std::char_traits<char>_> __x_18;
  basic_string_view<char,_std::char_traits<char>_> __x_19;
  basic_string_view<char,_std::char_traits<char>_> __x_20;
  basic_string_view<char,_std::char_traits<char>_> __x_21;
  basic_string_view<char,_std::char_traits<char>_> __x_22;
  basic_string_view<char,_std::char_traits<char>_> __x_23;
  basic_string_view<char,_std::char_traits<char>_> __x_24;
  basic_string_view<char,_std::char_traits<char>_> __x_25;
  basic_string_view<char,_std::char_traits<char>_> __x_26;
  basic_string_view<char,_std::char_traits<char>_> __x_27;
  basic_string_view<char,_std::char_traits<char>_> __x_28;
  basic_string_view<char,_std::char_traits<char>_> __x_29;
  basic_string_view<char,_std::char_traits<char>_> __x_30;
  basic_string_view<char,_std::char_traits<char>_> __x_31;
  basic_string_view<char,_std::char_traits<char>_> __x_32;
  basic_string_view<char,_std::char_traits<char>_> __x_33;
  basic_string_view<char,_std::char_traits<char>_> __x_34;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_17;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_18;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_19;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_20;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_21;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_22;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_23;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_24;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_25;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_26;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_27;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_28;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_29;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_30;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_31;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_32;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_33;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_34;
  
  __x._M_str = (char *)s._M_len;
  __x._M_len = (size_t)this;
  __y._M_str = "abs";
  __y._M_len = 3;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    IVar2 = abs;
  }
  else {
    __x_00._M_str = __x._M_str;
    __x_00._M_len = (size_t)this;
    __y_00._M_str = "min";
    __y_00._M_len = 3;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      IVar2 = min;
    }
    else {
      __x_01._M_str = __x._M_str;
      __x_01._M_len = (size_t)this;
      __y_01._M_str = "max";
      __y_01._M_len = 3;
      bVar1 = std::operator==(__x_01,__y_01);
      if (bVar1) {
        IVar2 = max;
      }
      else {
        __x_02._M_str = __x._M_str;
        __x_02._M_len = (size_t)this;
        __y_02._M_str = "clamp";
        __y_02._M_len = 5;
        bVar1 = std::operator==(__x_02,__y_02);
        if (bVar1) {
          IVar2 = clamp;
        }
        else {
          __x_03._M_str = __x._M_str;
          __x_03._M_len = (size_t)this;
          __y_03._M_str = "wrap";
          __y_03._M_len = 4;
          bVar1 = std::operator==(__x_03,__y_03);
          if (bVar1) {
            IVar2 = wrap;
          }
          else {
            __x_04._M_str = __x._M_str;
            __x_04._M_len = (size_t)this;
            __y_04._M_str = "fmod";
            __y_04._M_len = 4;
            bVar1 = std::operator==(__x_04,__y_04);
            if (bVar1) {
              IVar2 = fmod;
            }
            else {
              __x_05._M_str = __x._M_str;
              __x_05._M_len = (size_t)this;
              __y_05._M_str = "remainder";
              __y_05._M_len = 9;
              bVar1 = std::operator==(__x_05,__y_05);
              if (bVar1) {
                IVar2 = remainder;
              }
              else {
                __x_06._M_str = __x._M_str;
                __x_06._M_len = (size_t)this;
                __y_06._M_str = "floor";
                __y_06._M_len = 5;
                bVar1 = std::operator==(__x_06,__y_06);
                if (bVar1) {
                  IVar2 = floor;
                }
                else {
                  __x_07._M_str = __x._M_str;
                  __x_07._M_len = (size_t)this;
                  __y_07._M_str = "ceil";
                  __y_07._M_len = 4;
                  bVar1 = std::operator==(__x_07,__y_07);
                  if (bVar1) {
                    IVar2 = ceil;
                  }
                  else {
                    __x_08._M_str = __x._M_str;
                    __x_08._M_len = (size_t)this;
                    __y_08._M_str = "addModulo2Pi";
                    __y_08._M_len = 0xc;
                    bVar1 = std::operator==(__x_08,__y_08);
                    if (bVar1) {
                      IVar2 = addModulo2Pi;
                    }
                    else {
                      __x_09._M_str = __x._M_str;
                      __x_09._M_len = (size_t)this;
                      __y_09._M_str = "sqrt";
                      __y_09._M_len = 4;
                      bVar1 = std::operator==(__x_09,__y_09);
                      if (bVar1) {
                        IVar2 = sqrt;
                      }
                      else {
                        __x_10._M_str = __x._M_str;
                        __x_10._M_len = (size_t)this;
                        __y_10._M_str = "pow";
                        __y_10._M_len = 3;
                        bVar1 = std::operator==(__x_10,__y_10);
                        if (bVar1) {
                          IVar2 = pow;
                        }
                        else {
                          __x_11._M_str = __x._M_str;
                          __x_11._M_len = (size_t)this;
                          __y_11._M_str = "exp";
                          __y_11._M_len = 3;
                          bVar1 = std::operator==(__x_11,__y_11);
                          if (bVar1) {
                            IVar2 = exp;
                          }
                          else {
                            __x_12._M_str = __x._M_str;
                            __x_12._M_len = (size_t)this;
                            __y_12._M_str = "log";
                            __y_12._M_len = 3;
                            bVar1 = std::operator==(__x_12,__y_12);
                            if (bVar1) {
                              IVar2 = log;
                            }
                            else {
                              __x_13._M_str = __x._M_str;
                              __x_13._M_len = (size_t)this;
                              __y_13._M_str = "log10";
                              __y_13._M_len = 5;
                              bVar1 = std::operator==(__x_13,__y_13);
                              if (bVar1) {
                                IVar2 = log10;
                              }
                              else {
                                __x_14._M_str = __x._M_str;
                                __x_14._M_len = (size_t)this;
                                __y_14._M_str = "sin";
                                __y_14._M_len = 3;
                                bVar1 = std::operator==(__x_14,__y_14);
                                if (bVar1) {
                                  IVar2 = sin;
                                }
                                else {
                                  __x_15._M_str = __x._M_str;
                                  __x_15._M_len = (size_t)this;
                                  __y_15._M_str = "cos";
                                  __y_15._M_len = 3;
                                  bVar1 = std::operator==(__x_15,__y_15);
                                  if (bVar1) {
                                    IVar2 = cos;
                                  }
                                  else {
                                    __x_16._M_str = __x._M_str;
                                    __x_16._M_len = (size_t)this;
                                    __y_16._M_str = "tan";
                                    __y_16._M_len = 3;
                                    bVar1 = std::operator==(__x_16,__y_16);
                                    if (bVar1) {
                                      IVar2 = tan;
                                    }
                                    else {
                                      __x_17._M_str = __x._M_str;
                                      __x_17._M_len = (size_t)this;
                                      __y_17._M_str = "sinh";
                                      __y_17._M_len = 4;
                                      bVar1 = std::operator==(__x_17,__y_17);
                                      if (bVar1) {
                                        IVar2 = sinh;
                                      }
                                      else {
                                        __x_18._M_str = __x._M_str;
                                        __x_18._M_len = (size_t)this;
                                        __y_18._M_str = "cosh";
                                        __y_18._M_len = 4;
                                        bVar1 = std::operator==(__x_18,__y_18);
                                        if (bVar1) {
                                          IVar2 = cosh;
                                        }
                                        else {
                                          __x_19._M_str = __x._M_str;
                                          __x_19._M_len = (size_t)this;
                                          __y_19._M_str = "tanh";
                                          __y_19._M_len = 4;
                                          bVar1 = std::operator==(__x_19,__y_19);
                                          if (bVar1) {
                                            IVar2 = tanh;
                                          }
                                          else {
                                            __x_20._M_str = __x._M_str;
                                            __x_20._M_len = (size_t)this;
                                            __y_20._M_str = "asinh";
                                            __y_20._M_len = 5;
                                            bVar1 = std::operator==(__x_20,__y_20);
                                            if (bVar1) {
                                              IVar2 = asinh;
                                            }
                                            else {
                                              __x_21._M_str = __x._M_str;
                                              __x_21._M_len = (size_t)this;
                                              __y_21._M_str = "acosh";
                                              __y_21._M_len = 5;
                                              bVar1 = std::operator==(__x_21,__y_21);
                                              if (bVar1) {
                                                IVar2 = acosh;
                                              }
                                              else {
                                                __x_22._M_str = __x._M_str;
                                                __x_22._M_len = (size_t)this;
                                                __y_22._M_str = "atanh";
                                                __y_22._M_len = 5;
                                                bVar1 = std::operator==(__x_22,__y_22);
                                                if (bVar1) {
                                                  IVar2 = atanh;
                                                }
                                                else {
                                                  __x_23._M_str = __x._M_str;
                                                  __x_23._M_len = (size_t)this;
                                                  __y_23._M_str = "asin";
                                                  __y_23._M_len = 4;
                                                  bVar1 = std::operator==(__x_23,__y_23);
                                                  if (bVar1) {
                                                    IVar2 = asin;
                                                  }
                                                  else {
                                                    __x_24._M_str = __x._M_str;
                                                    __x_24._M_len = (size_t)this;
                                                    __y_24._M_str = "acos";
                                                    __y_24._M_len = 4;
                                                    bVar1 = std::operator==(__x_24,__y_24);
                                                    if (bVar1) {
                                                      IVar2 = acos;
                                                    }
                                                    else {
                                                      __x_25._M_str = __x._M_str;
                                                      __x_25._M_len = (size_t)this;
                                                      __y_25._M_str = "atan";
                                                      __y_25._M_len = 4;
                                                      bVar1 = std::operator==(__x_25,__y_25);
                                                      if (bVar1) {
                                                        IVar2 = atan;
                                                      }
                                                      else {
                                                        __x_26._M_str = __x._M_str;
                                                        __x_26._M_len = (size_t)this;
                                                        __y_26._M_str = "atan2";
                                                        __y_26._M_len = 5;
                                                        bVar1 = std::operator==(__x_26,__y_26);
                                                        if (bVar1) {
                                                          IVar2 = atan2;
                                                        }
                                                        else {
                                                          __x_27._M_str = __x._M_str;
                                                          __x_27._M_len = (size_t)this;
                                                          __y_27._M_str = "isnan";
                                                          __y_27._M_len = 5;
                                                          bVar1 = std::operator==(__x_27,__y_27);
                                                          if (bVar1) {
                                                            IVar2 = isnan;
                                                          }
                                                          else {
                                                            __x_28._M_str = __x._M_str;
                                                            __x_28._M_len = (size_t)this;
                                                            __y_28._M_str = "isinf";
                                                            __y_28._M_len = 5;
                                                            bVar1 = std::operator==(__x_28,__y_28);
                                                            if (bVar1) {
                                                              IVar2 = isinf;
                                                            }
                                                            else {
                                                              __x_29._M_str = __x._M_str;
                                                              __x_29._M_len = (size_t)this;
                                                              __y_29._M_str = "roundToInt";
                                                              __y_29._M_len = 10;
                                                              bVar1 = std::operator==(__x_29,__y_29)
                                                              ;
                                                              if (bVar1) {
                                                                IVar2 = roundToInt;
                                                              }
                                                              else {
                                                                __x_30._M_str = __x._M_str;
                                                                __x_30._M_len = (size_t)this;
                                                                __y_30._M_str = "sum";
                                                                __y_30._M_len = 3;
                                                                bVar1 = std::operator==(__x_30,
                                                  __y_30);
                                                  if (bVar1) {
                                                    IVar2 = sum;
                                                  }
                                                  else {
                                                    __x_31._M_str = __x._M_str;
                                                    __x_31._M_len = (size_t)this;
                                                    __y_31._M_str = "product";
                                                    __y_31._M_len = 7;
                                                    bVar1 = std::operator==(__x_31,__y_31);
                                                    if (bVar1) {
                                                      IVar2 = product;
                                                    }
                                                    else {
                                                      __x_32._M_str = __x._M_str;
                                                      __x_32._M_len = (size_t)this;
                                                      __y_32._M_str = "get_array_size";
                                                      __y_32._M_len = 0xe;
                                                      bVar1 = std::operator==(__x_32,__y_32);
                                                      if (bVar1) {
                                                        IVar2 = get_array_size;
                                                      }
                                                      else {
                                                        __x_33._M_str = __x._M_str;
                                                        __x_33._M_len = (size_t)this;
                                                        __y_33._M_str = "read";
                                                        __y_33._M_len = 4;
                                                        bVar1 = std::operator==(__x_33,__y_33);
                                                        if (bVar1) {
                                                          IVar2 = read;
                                                        }
                                                        else {
                                                          __x_34._M_str = __x._M_str;
                                                          __x_34._M_len = (size_t)this;
                                                          __y_34._M_str = "readLinearInterpolated";
                                                          __y_34._M_len = 0x16;
                                                          bVar1 = std::operator==(__x_34,__y_34);
                                                          IVar2 = readLinearInterpolated;
                                                          if (!bVar1) {
                                                            IVar2 = none;
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return IVar2;
}

Assistant:

IntrinsicType getIntrinsicTypeFromName (std::string_view s)
{
    #define SOUL_MATCH_INTRINSIC(i)  if (s == #i) return IntrinsicType::i;
    SOUL_INTRINSICS (SOUL_MATCH_INTRINSIC)
    #undef SOUL_MATCH_INTRINSIC

    return IntrinsicType::none;
}